

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

uint __thiscall jpgd::jpeg_decoder::get_char(jpeg_decoder *this,bool *pPadding_flag)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  int iVar4;
  
  iVar4 = this->m_in_buf_left;
  if (iVar4 == 0) {
    prep_in_buffer(this);
    iVar4 = this->m_in_buf_left;
    if (iVar4 == 0) {
      *pPadding_flag = true;
      uVar2 = this->m_tem_flag;
      this->m_tem_flag = uVar2 ^ 1;
      if (uVar2 != 0) {
        return 0xd9;
      }
      return 0xff;
    }
  }
  *pPadding_flag = false;
  pbVar3 = this->m_pIn_buf_ofs;
  this->m_pIn_buf_ofs = pbVar3 + 1;
  bVar1 = *pbVar3;
  this->m_in_buf_left = iVar4 + -1;
  return (uint)bVar1;
}

Assistant:

inline uint jpeg_decoder::get_char(bool* pPadding_flag)
	{
		if (!m_in_buf_left)
		{
			prep_in_buffer();
			if (!m_in_buf_left)
			{
				*pPadding_flag = true;
				int t = m_tem_flag;
				m_tem_flag ^= 1;
				if (t)
					return 0xD9;
				else
					return 0xFF;
			}
		}

		*pPadding_flag = false;

		uint c = *m_pIn_buf_ofs++;
		m_in_buf_left--;

		return c;
	}